

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelaunayMST.h
# Opt level: O1

void __thiscall DelaunayMST::add(DelaunayMST *this,int x,int y)

{
  int iVar1;
  EListNode *pEVar2;
  int *piVar3;
  long lVar4;
  
  pEVar2 = (this->e)._M_t.
           super___uniq_ptr_impl<DelaunayMST::EListNode,_std::default_delete<DelaunayMST::EListNode[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_DelaunayMST::EListNode_*,_std::default_delete<DelaunayMST::EListNode[]>_>
           .super__Head_base<0UL,_DelaunayMST::EListNode_*,_false>._M_head_impl;
  piVar3 = (this->last)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  iVar1 = piVar3[x];
  lVar4 = (long)this->eCnt + 1;
  this->eCnt = (int)lVar4;
  pEVar2[lVar4].to = y;
  pEVar2[lVar4].prev = iVar1;
  pEVar2[lVar4].next = 0;
  iVar1 = this->eCnt;
  pEVar2[piVar3[x]].next = iVar1;
  piVar3[x] = iVar1;
  iVar1 = piVar3[y];
  lVar4 = (long)this->eCnt + 1;
  this->eCnt = (int)lVar4;
  pEVar2[lVar4].to = x;
  pEVar2[lVar4].prev = iVar1;
  pEVar2[lVar4].next = 0;
  iVar1 = this->eCnt;
  pEVar2[piVar3[y]].next = iVar1;
  piVar3[y] = iVar1;
  return;
}

Assistant:

void add(int x, int y)
	{
		e[++eCnt] = {y, last[x]};
		e[last[x]].next = eCnt, last[x] = eCnt;
		e[++eCnt] = {x, last[y]};
		e[last[y]].next = eCnt, last[y] = eCnt;
	}